

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O0

Status * __thiscall draco::PlyDecoder::DecodeInternal(PlyDecoder *this)

{
  undefined1 uVar1;
  bool bVar2;
  ValueType VVar3;
  uint uVar4;
  PlyDecoder *in_RSI;
  Status *in_RDI;
  PlyElement *in_stack_00000030;
  PlyDecoder *in_stack_00000038;
  DecoderBuffer *in_stack_00000050;
  PlyReader *in_stack_00000058;
  PlyReader ply_reader;
  Status *_local_status;
  PlyElement *in_stack_000005a0;
  PlyDecoder *in_stack_000005a8;
  Code in_stack_fffffffffffffe9c;
  PlyReader *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  PlyReader *in_stack_fffffffffffffeb8;
  PlyElement *in_stack_fffffffffffffed0;
  allocator<char> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 local_f1 [40];
  allocator<char> local_c9;
  string local_c8 [38];
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [39];
  byte local_79;
  uint local_78;
  byte local_61;
  
  PlyReader::PlyReader(in_stack_fffffffffffffea0);
  local_61 = 0;
  buffer(in_RSI);
  PlyReader::Read(in_stack_00000058,in_stack_00000050);
  uVar1 = Status::ok(in_RDI);
  if (!(bool)uVar1) {
    local_61 = 1;
  }
  local_78 = (uint)!(bool)uVar1;
  if ((local_61 & 1) == 0) {
    Status::~Status((Status *)0x12f55a);
  }
  if (local_78 == 0) {
    if (in_RSI->out_mesh_ != (Mesh *)0x0) {
      local_79 = 0;
      in_stack_fffffffffffffed8 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffee0),(char *)in_stack_fffffffffffffed8,
                 (allocator<char> *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffed0 =
           PlyReader::GetElementByName
                     (in_stack_fffffffffffffeb8,
                      (string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      DecodeFaceData(in_stack_00000038,in_stack_00000030);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
      bVar2 = Status::ok(in_RDI);
      if (!bVar2) {
        local_79 = 1;
      }
      local_78 = (uint)!bVar2;
      if ((local_79 & 1) == 0) {
        Status::~Status((Status *)0x12f6ba);
      }
      if (local_78 != 0) goto LAB_0012f93f;
    }
    local_a2 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffee0),(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    PlyReader::GetElementByName
              (in_stack_fffffffffffffeb8,
               (string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    DecodeVertexData(in_stack_000005a8,in_stack_000005a0);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    bVar2 = Status::ok(in_RDI);
    if (!bVar2) {
      local_a2 = 1;
    }
    local_78 = (uint)!bVar2;
    if ((local_a2 & 1) == 0) {
      Status::~Status((Status *)0x12f80c);
    }
    if (local_78 == 0) {
      if ((in_RSI->out_mesh_ != (Mesh *)0x0) &&
         (VVar3 = Mesh::num_faces((Mesh *)0x12f83b), VVar3 != 0)) {
        uVar4 = (*in_RSI->out_point_cloud_->_vptr_PointCloud[4])();
        if ((uVar4 & 1) == 0) {
          in_stack_fffffffffffffea0 = (PlyReader *)local_f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffffee0),(char *)in_stack_fffffffffffffed8,
                     (allocator<char> *)in_stack_fffffffffffffed0);
          Status::Status((Status *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         (string *)0x12f8af);
          std::__cxx11::string::~string((string *)(local_f1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_f1);
          local_78 = 1;
          goto LAB_0012f93f;
        }
        (*in_RSI->out_point_cloud_->_vptr_PointCloud[5])();
      }
      OkStatus();
      local_78 = 1;
    }
  }
LAB_0012f93f:
  PlyReader::~PlyReader(in_stack_fffffffffffffea0);
  return in_RDI;
}

Assistant:

Status PlyDecoder::DecodeInternal() {
  PlyReader ply_reader;
  DRACO_RETURN_IF_ERROR(ply_reader.Read(buffer()));
  // First, decode the connectivity data.
  if (out_mesh_)
    DRACO_RETURN_IF_ERROR(DecodeFaceData(ply_reader.GetElementByName("face")));
  // Decode all attributes.
  DRACO_RETURN_IF_ERROR(
      DecodeVertexData(ply_reader.GetElementByName("vertex")));
  // In case there are no faces this is just a point cloud which does
  // not require deduplication.
  if (out_mesh_ && out_mesh_->num_faces() != 0) {
#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
    if (!out_point_cloud_->DeduplicateAttributeValues()) {
      return Status(Status::DRACO_ERROR,
                    "Could not deduplicate attribute values");
    }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
    out_point_cloud_->DeduplicatePointIds();
#endif
  }
  return OkStatus();
}